

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mpi_write_hlp(mbedtls_mpi *X,int radix,char **p,size_t buflen)

{
  int iVar1;
  char *local_50;
  char *p_end;
  size_t length;
  mbedtls_mpi_uint r;
  char *pcStack_30;
  int ret;
  size_t buflen_local;
  char **p_local;
  mbedtls_mpi *pmStack_18;
  int radix_local;
  mbedtls_mpi *X_local;
  
  r._4_4_ = -0x6e;
  p_end = (char *)0x0;
  local_50 = *p + buflen;
  pcStack_30 = (char *)buflen;
  buflen_local = (size_t)p;
  p_local._4_4_ = radix;
  pmStack_18 = X;
  do {
    if (pcStack_30 <= p_end) {
      return -8;
    }
    r._4_4_ = mbedtls_mpi_mod_int(&length,pmStack_18,(long)p_local._4_4_);
    if (r._4_4_ != 0) {
      return r._4_4_;
    }
    r._4_4_ = mbedtls_mpi_div_int(pmStack_18,(mbedtls_mpi *)0x0,pmStack_18,(long)p_local._4_4_);
    if (r._4_4_ != 0) {
      return r._4_4_;
    }
    if (length < 10) {
      local_50[-1] = (char)length + '0';
    }
    else {
      local_50[-1] = (char)length + '7';
    }
    local_50 = local_50 + -1;
    p_end = p_end + 1;
    iVar1 = mbedtls_mpi_cmp_int(pmStack_18,0);
  } while (iVar1 != 0);
  memmove(*(void **)buflen_local,local_50,(size_t)p_end);
  *(char **)buflen_local = p_end + *(long *)buflen_local;
  return r._4_4_;
}

Assistant:

static int mpi_write_hlp( mbedtls_mpi *X, int radix,
                          char **p, const size_t buflen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi_uint r;
    size_t length = 0;
    char *p_end = *p + buflen;

    do
    {
        if( length >= buflen )
        {
            return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
        }

        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, radix ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_div_int( X, NULL, X, radix ) );
        /*
         * Write the residue in the current position, as an ASCII character.
         */
        if( r < 0xA )
            *(--p_end) = (char)( '0' + r );
        else
            *(--p_end) = (char)( 'A' + ( r - 0xA ) );

        length++;
    } while( mbedtls_mpi_cmp_int( X, 0 ) != 0 );

    memmove( *p, p_end, length );
    *p += length;

cleanup:

    return( ret );
}